

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.hpp
# Opt level: O0

vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
* __thiscall
plot::detail::
vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
::next(vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
       *__return_storage_ptr__,
      vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
      *this)

{
  VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
  *vbox;
  size_t sVar1;
  block_iterators local_d8;
  block_iterators local_78;
  vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
  *local_18;
  vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
  *this_local;
  
  local_18 = this;
  this_local = __return_storage_ptr__;
  if (this->margin_ == 0) {
    vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>>
    ::next_impl<0ul,1ul>
              (__return_storage_ptr__,
               (vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>>
                *)this);
  }
  else {
    vbox = this->vbox_;
    sVar1 = this->margin_;
    memcpy(&local_78,&this->lines_,0x60);
    memcpy(&local_d8,&this->ends_,0x60);
    vbox_line(__return_storage_ptr__,vbox,sVar1 - 1,&local_78,&local_d8);
  }
  return __return_storage_ptr__;
}

Assistant:

vbox_line next() const {
            return margin_ ? vbox_line(vbox_, margin_ - 1, lines_, ends_)
                           : next_impl(std::make_index_sequence<sizeof...(Blocks)>());
        }